

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O0

void __thiscall tst_future::finally(tst_future *this)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  bool local_8a;
  bool local_89;
  int *local_88;
  QPromiseBase<int> local_80;
  QPromiseBase<void> local_70;
  int local_5c;
  bool local_56;
  bool local_55;
  int value;
  bool local_4e;
  bool local_4d [21];
  undefined1 local_38 [8];
  QPromise<int> output;
  undefined1 local_20 [8];
  Type input;
  tst_future *this_local;
  
  output.super_QPromiseBase<int>.m_d.d._4_4_ = 0x2a;
  input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  TVar3 = QtPromise::resolve<int>
                    ((QtPromise *)local_20,(int *)((long)&output.super_QPromiseBase<int>.m_d.d + 4))
  ;
  QtPromise::QPromiseBase<int>::finally<tst_future::finally()::__0>
            ((QPromiseBase<int> *)local_38,(QtPromise *)local_20,
             TVar3.super_QPromiseBase<int>.m_d.d.d);
  local_4d[0] = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_20);
  local_4e = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (local_4d,&local_4e,"input.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                     ,0x148);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_55 = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_38);
    local_56 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (&local_55,&local_56,"output.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                       ,0x149);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_5c = -1;
      local_88 = &local_5c;
      QtPromise::QPromiseBase<int>::then<tst_future::finally()::__1>
                (&local_80,(anon_class_8_1_a8c68091 *)local_38);
      QtPromise::QPromiseBase<void>::wait(&local_70,&local_80);
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_70);
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_80);
      local_89 = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_38);
      local_8a = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_89,&local_8a,"output.isFulfilled()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                         ,0x152);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        bVar2 = QTest::qCompare(local_5c,0x2a,"value","42",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                                ,0x153);
        if ((bVar2 & 1) == 0) {
          value = 1;
        }
        else {
          value = 0;
        }
      }
      else {
        value = 1;
      }
    }
    else {
      value = 1;
    }
  }
  else {
    value = 1;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_38);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  return;
}

Assistant:

void tst_future::finally()
{
    auto input = QtPromise::resolve(42);
    auto output = input.finally([]() {
        return QtConcurrent::run([]() {
            return QString{"foo"};
        });
    });

    Q_STATIC_ASSERT((std::is_same<decltype(output), QtPromise::QPromise<int>>::value));

    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isPending(), true);

    int value = -1;
    output
        .then([&](int res) {
            value = res;
        })
        .wait();

    QCOMPARE(output.isFulfilled(), true);
    QCOMPARE(value, 42);
}